

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QCalendarPopup::mousePressEvent(QCalendarPopup *this,QMouseEvent *event)

{
  QWidgetData *pQVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  QWidget *widget;
  QStyle *pQVar5;
  QPoint QVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  QStyleOptionComboBox opt;
  undefined8 local_f0;
  QPoint local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  QPoint local_d0;
  int local_c8;
  int local_c4;
  QStyleOptionComboBox local_c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  widget = (QWidget *)QMetaObject::cast((QObject *)&QDateTimeEdit::staticMetaObject);
  if (widget == (QWidget *)0x0) goto LAB_003ea30d;
  memset(&local_c0,0xaa,0x90);
  QStyleOptionComboBox::QStyleOptionComboBox(&local_c0);
  QStyleOption::initFrom((QStyleOption *)&local_c0,widget);
  pQVar5 = QWidget::style(widget);
  auVar9 = (**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,1,&local_c0,4,widget);
  local_e8 = auVar9._0_8_;
  QVar6 = QWidget::mapToGlobal(widget,&local_e8);
  local_d0.xp = QVar6.xp.m_i;
  local_c8 = (local_d0.xp.m_i - auVar9._0_4_) + auVar9._8_4_;
  local_d0.yp = QVar6.yp.m_i;
  local_c4 = auVar9._12_4_ + (local_d0.yp.m_i - auVar9._4_4_);
  auVar9 = QEventPoint::globalPosition();
  dVar8 = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._0_8_;
  bVar2 = 2147483647.0 < dVar8;
  if (dVar8 <= -2147483648.0) {
    dVar8 = -2147483648.0;
  }
  dVar7 = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._8_8_;
  bVar3 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  local_d8 = CONCAT44((int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar3 & (ulong)dVar7),
                      (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar2 & (ulong)dVar8));
  cVar4 = QRect::contains(&local_d0,SUB81(&local_d8,0));
  if (cVar4 == '\0') {
    pQVar1 = (this->super_QWidget).data;
    local_e0 = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                        (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
    local_e8.xp.m_i = 0;
    local_e8.yp.m_i = 0;
    auVar9 = QEventPoint::position();
    dVar8 = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._0_8_;
    bVar2 = 2147483647.0 < dVar8;
    if (dVar8 <= -2147483648.0) {
      dVar8 = -2147483648.0;
    }
    dVar7 = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._8_8_;
    bVar3 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_f0 = CONCAT44((int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar3 & (ulong)dVar7),
                        (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar2 & (ulong)dVar8));
    cVar4 = QRect::contains(&local_e8,SUB81(&local_f0,0));
    if (cVar4 != '\0') goto LAB_003ea2bc;
  }
  else {
LAB_003ea2bc:
    QWidget::setAttribute(&this->super_QWidget,WA_NoMouseReplay,true);
  }
  QIcon::~QIcon(&local_c0.currentIcon);
  if (&(local_c0.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_c0.currentText.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
LAB_003ea30d:
  QWidget::mousePressEvent(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarPopup::mousePressEvent(QMouseEvent *event)
{
    QDateTimeEdit *dateTime = qobject_cast<QDateTimeEdit *>(parentWidget());
    if (dateTime) {
        QStyleOptionComboBox opt;
        opt.initFrom(dateTime);
        QRect arrowRect = dateTime->style()->subControlRect(QStyle::CC_ComboBox, &opt,
                                                            QStyle::SC_ComboBoxArrow, dateTime);
        arrowRect.moveTo(dateTime->mapToGlobal(arrowRect .topLeft()));
        if (arrowRect.contains(event->globalPosition().toPoint()) || rect().contains(event->position().toPoint()))
            setAttribute(Qt::WA_NoMouseReplay);
    }
    QWidget::mousePressEvent(event);
}